

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2926b4::TestCallback::fromAdmin
          (TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  string *psVar1;
  undefined1 *puVar2;
  undefined1 local_78 [8];
  MsgType msgType;
  SessionID *param_2_local;
  Message *message_local;
  TestCallback *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics = (field_metrics)param_2;
  FIX::MsgType::MsgType((MsgType *)local_78);
  this_00 = &FIX::Message::getHeader(message)->super_FieldMap;
  FIX::FieldMap::getField(this_00,(FieldBase *)local_78);
  psVar1 = FIX::StringField::getValue_abi_cxx11_((StringField *)local_78);
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psVar1);
  switch(*puVar2) {
  case 0x30:
    this->fromHeartbeat = this->fromHeartbeat + 1;
    break;
  case 0x31:
    this->fromTestRequest = this->fromTestRequest + 1;
    break;
  case 0x33:
    this->fromReject = this->fromReject + 1;
    break;
  case 0x34:
    this->fromSequenceReset = this->fromSequenceReset + 1;
    break;
  case 0x35:
    this->fromLogout = this->fromLogout + 1;
  }
  FIX::MsgType::~MsgType((MsgType *)local_78);
  return;
}

Assistant:

EXCEPT(FieldNotFound, IncorrectDataFormat, IncorrectTagValue, RejectLogon) {
    MsgType msgType;
    message.getHeader().getField(msgType);
    switch (msgType.getValue()[0]) {
    case '0':
      fromHeartbeat++;
      break;
    case '1':
      fromTestRequest++;
      break;
    case '5':
      fromLogout++;
      break;
    case '3':
      fromReject++;
      break;
    case '4':
      fromSequenceReset++;
      break;
    }
  }